

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTEnc(octet *der,u32 tag)

{
  bool_t bVar1;
  u32 in_ESI;
  long in_RDI;
  size_t pos;
  u32 t;
  size_t t_count;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_8;
  
  local_20 = 0;
  bVar1 = derTIsValid(in_ESI);
  local_24 = in_ESI;
  if (bVar1 == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    for (; local_24 != 0; local_24 = local_24 >> 8) {
      local_20 = local_20 + 1;
    }
    if (local_20 == 0) {
      local_20 = 1;
    }
    if (in_RDI != 0) {
      local_30 = local_20;
      local_14 = in_ESI;
      while (local_30 != 0) {
        *(char *)(in_RDI + (local_30 - 1)) = (char)local_14;
        local_14 = local_14 >> 8;
        local_30 = local_30 - 1;
      }
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static size_t derTEnc(octet der[], u32 tag)
{
	size_t t_count = 0;
	// проверить корректность
	if (!derTIsValid(tag))
		return SIZE_MAX;
	// определить длину кода
	{
		u32 t = tag;
		for (; t; ++t_count, t >>= 8);
		if (t_count == 0)
			t_count = 1;
	}
	// кодировать
	if (der)
	{
		size_t pos = t_count;
		ASSERT(memIsValid(der, t_count));
		while (pos--)
		{
			der[pos] = (octet)tag;
			tag >>= 8;
		}
		ASSERT(tag == 0);
	}
	return t_count;
}